

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O0

bool __thiscall jsonnet::Jsonnet::evaluateFile(Jsonnet *this,string *filename,string *output)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char *in_RDX;
  undefined8 *in_RDI;
  char *jsonnet_output;
  int error;
  int local_24;
  char *local_20;
  bool local_1;
  
  if (in_RDX == (char *)0x0) {
    local_1 = false;
  }
  else {
    local_24 = 0;
    uVar2 = *in_RDI;
    local_20 = in_RDX;
    uVar1 = std::__cxx11::string::c_str();
    uVar2 = jsonnet_evaluate_file(uVar2,uVar1,&local_24);
    if (local_24 == 0) {
      std::__cxx11::string::assign(local_20);
      jsonnet_realloc(*in_RDI,uVar2,0);
      local_1 = true;
    }
    else {
      std::__cxx11::string::assign((char *)(in_RDI + 1));
      jsonnet_realloc(*in_RDI,uVar2,0);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Jsonnet::evaluateFile(const std::string& filename, std::string* output)
{
    if (output == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output = ::jsonnet_evaluate_file(vm_, filename.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    output->assign(jsonnet_output);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}